

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O2

void __thiscall
duckdb::ColumnReader::PlainSelectTemplated<duckdb::string_t,duckdb::StringParquetValueConversion>
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values,
          Vector *result,SelectionVector *sel,idx_t approved_tuple_count)

{
  data_ptr_t pdVar1;
  ulong uVar2;
  ulong uVar3;
  ulong row_offset;
  string_t sVar4;
  
  if ((defines != (uint8_t *)0x0) && (this->column_schema->max_define != 0)) {
    PlainSelectTemplatedInternal<duckdb::string_t,duckdb::StringParquetValueConversion,true,true>
              (this,plain_data,defines,num_values,result,sel,approved_tuple_count);
    return;
  }
  pdVar1 = result->data;
  FlatVector::VerifyFlatVector(result);
  row_offset = 0;
  for (uVar2 = 0; approved_tuple_count != uVar2; uVar2 = uVar2 + 1) {
    uVar3 = uVar2;
    if (sel->sel_vector != (sel_t *)0x0) {
      uVar3 = (ulong)sel->sel_vector[uVar2];
    }
    PlainSkipTemplatedInternal<duckdb::StringParquetValueConversion,false,true>
              (this,plain_data,defines,uVar3 - row_offset,row_offset);
    sVar4 = StringParquetValueConversion::PlainRead<true>(plain_data,this);
    *(long *)(pdVar1 + uVar3 * 0x10) = sVar4.value._0_8_;
    *(long *)(pdVar1 + uVar3 * 0x10 + 8) = sVar4.value._8_8_;
    row_offset = uVar3 + 1;
  }
  if (row_offset <= num_values && num_values - row_offset != 0) {
    PlainSkipTemplatedInternal<duckdb::StringParquetValueConversion,false,true>
              (this,plain_data,defines,num_values - row_offset,row_offset);
    return;
  }
  return;
}

Assistant:

void PlainSelectTemplated(ByteBuffer &plain_data, const uint8_t *defines, uint64_t num_values, Vector &result,
	                          const SelectionVector &sel, idx_t approved_tuple_count) {
		if (HasDefines() && defines) {
			PlainSelectTemplatedInternal<VALUE_TYPE, CONVERSION, true, true>(plain_data, defines, num_values, result,
			                                                                 sel, approved_tuple_count);
		} else {
			PlainSelectTemplatedInternal<VALUE_TYPE, CONVERSION, false, true>(plain_data, defines, num_values, result,
			                                                                  sel, approved_tuple_count);
		}
	}